

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O1

unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
__thiscall cppcms::crypto::message_digest::create_by_name(message_digest *this,string *namein)

{
  pointer pcVar1;
  uint uVar2;
  int iVar3;
  _func_int **pp_Var4;
  ulong uVar5;
  pointer *__ptr;
  string name;
  undefined1 *local_48;
  ulong local_40;
  undefined1 local_38 [16];
  _func_int **local_28;
  
  this->_vptr_message_digest = (_func_int **)0x0;
  pcVar1 = (namein->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + namein->_M_string_length);
  if (local_40 != 0) {
    uVar2 = 1;
    uVar5 = 0;
    do {
      if ((byte)(local_48[uVar5] + 0xbf) < 0x1a) {
        local_48[uVar5] = local_48[uVar5] | 0x20;
      }
      uVar5 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar5 < local_40);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_48);
  if (iVar3 == 0) {
    md5();
    pp_Var4 = local_28;
    local_28 = (_func_int **)0x0;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_48);
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)&local_48);
      if (iVar3 == 0) {
        pp_Var4 = (_func_int **)operator_new(0x78);
        *pp_Var4 = (_func_int *)&PTR__ssl_sha224_0028cc58;
        SHA224_Init((SHA256_CTX *)(pp_Var4 + 1));
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_48);
        if (iVar3 == 0) {
          pp_Var4 = (_func_int **)operator_new(0x78);
          *pp_Var4 = (_func_int *)&PTR__ssl_sha256_0028ccc0;
          SHA256_Init((SHA256_CTX *)(pp_Var4 + 1));
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_48);
          if (iVar3 == 0) {
            pp_Var4 = (_func_int **)operator_new(0xe0);
            *pp_Var4 = (_func_int *)&PTR__ssl_sha384_0028cd28;
            SHA384_Init((SHA512_CTX *)(pp_Var4 + 1));
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_48);
            if (iVar3 != 0) goto LAB_00219937;
            pp_Var4 = (_func_int **)operator_new(0xe0);
            *pp_Var4 = (_func_int *)&PTR__ssl_sha512_0028cd90;
            SHA512_Init((SHA512_CTX *)(pp_Var4 + 1));
          }
        }
      }
      this->_vptr_message_digest = pp_Var4;
      goto LAB_00219937;
    }
    pp_Var4 = (_func_int **)operator_new(0x70);
    *pp_Var4 = (_func_int *)&PTR__sha1_digets_0028cbf0;
    pp_Var4[1] = (_func_int *)0xefcdab8967452301;
    pp_Var4[2] = (_func_int *)0x1032547698badcfe;
    *(undefined4 *)(pp_Var4 + 3) = 0xc3d2e1f0;
    pp_Var4[0xc] = (_func_int *)0x0;
    pp_Var4[0xd] = (_func_int *)0x0;
  }
  this->_vptr_message_digest = pp_Var4;
LAB_00219937:
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return (__uniq_ptr_data<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>,_true,_true>
          )(__uniq_ptr_data<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<message_digest> message_digest::create_by_name(std::string const &namein)
	{
		std::unique_ptr<message_digest> d;
		std::string name = namein;
		for(unsigned i=0;i<name.size();i++)
			if('A' <= name[i] && name[i]<='Z')
				name[i] = name[i] - 'A' + 'a';
		if(name=="md5")
			d = md5();
		else if(name == "sha1")
			d = sha1();
		#ifdef CPPCMS_HAVE_GCRYPT
		else if(name == "sha224")
			d.reset(new gcrypt_digets(GCRY_MD_SHA224));
		else if(name == "sha256")
			d.reset(new gcrypt_digets(GCRY_MD_SHA256));
		else if(name == "sha384")
			d.reset(new gcrypt_digets(GCRY_MD_SHA384));
		else if(name == "sha512")
			d.reset(new gcrypt_digets(GCRY_MD_SHA512));
		#endif

		#ifdef CPPCMS_HAVE_OPENSSL
		else if(name == "sha224")
			d.reset(new ssl_sha224());
		else if(name == "sha256")
			d.reset(new ssl_sha256());
		else if(name == "sha384")
			d.reset(new ssl_sha384());
		else if(name == "sha512")
			d.reset(new ssl_sha512());
		#endif
		
		return d;
	}